

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O3

AutoFile * __thiscall
AutoFile::operator<<(AutoFile *this,vector<std::byte,_std::allocator<std::byte>_> *obj)

{
  long lVar1;
  pointer pbVar2;
  pointer pbVar3;
  size_t in_RCX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<AutoFile>
            (this,(long)(obj->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(obj->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
                        super__Vector_impl_data._M_start);
  pbVar2 = (obj->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pbVar3 = (obj->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pbVar2 != pbVar3) {
    write(this,(int)pbVar2,pbVar3 + -(long)pbVar2,in_RCX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

AutoFile& operator<<(const T& obj)
    {
        ::Serialize(*this, obj);
        return *this;
    }